

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O3

int http_open(HTTP_INFO *hi,char *url)

{
  BOOL verify;
  int iVar1;
  int iVar2;
  size_t sVar3;
  byte https_00;
  int opt;
  char port [10];
  socklen_t slen;
  int https;
  char host [256];
  char dir [1024];
  int local_550;
  char local_54a [10];
  socklen_t local_540;
  uint local_53c;
  char local_538 [256];
  char local_438 [1032];
  
  if (hi == (HTTP_INFO *)0x0) {
    return -1;
  }
  verify = (hi->tls).verify;
  parse_url(url,(int *)&local_53c,local_538,local_54a,local_438);
  iVar2 = (hi->tls).ssl_fd.fd;
  if (iVar2 == -1) {
LAB_00111bcc:
    https_00 = (byte)local_53c;
  }
  else {
    https_00 = (hi->url).https;
    if (((local_53c != https_00) || (iVar1 = strcmp((hi->url).host,local_538), iVar1 != 0)) ||
       (iVar1 = strcmp((hi->url).port,local_54a), iVar1 != 0)) {
      https_close(hi);
      goto LAB_00111bcc;
    }
    local_540 = 4;
    iVar2 = getsockopt(iVar2,1,4,&local_550,&local_540);
    if ((-1 < iVar2) && (local_550 < 1)) goto LAB_00111bf2;
    https_close(hi);
  }
  https_init(hi,https_00,verify);
  iVar2 = https_connect(hi,local_538,local_54a);
  if (iVar2 < 0) {
    https_close(hi);
    _error = iVar2;
    return -1;
  }
LAB_00111bf2:
  sVar3 = strlen(local_538);
  strncpy((hi->url).host,local_538,sVar3);
  sVar3 = strlen(local_54a);
  strncpy((hi->url).port,local_54a,sVar3);
  sVar3 = strlen(local_438);
  strncpy((hi->url).path,local_438,sVar3);
  return 0;
}

Assistant:

int http_open(HTTP_INFO *hi, char *url)
{
    char        host[256], port[10], dir[1024];
    int         sock_fd, https, verify;
    int         ret, opt;
    socklen_t   slen;


    if (NULL == hi) return -1;

    verify = hi->tls.verify;

    parse_url(url, &https, host, port, dir);

    if ((hi->tls.ssl_fd.fd == -1) || (hi->url.https != https) ||
        (strcmp(hi->url.host, host) != 0) || (strcmp(hi->url.port, port) != 0))
    {
        if (hi->tls.ssl_fd.fd != -1)
            https_close(hi);

        https_init(hi, https, verify);

        if ((ret = https_connect(hi, host, port)) < 0)
        {
            https_close(hi);

            _error = ret;

            return -1;
        }
    }
    else
    {
        sock_fd = hi->tls.ssl_fd.fd;

        slen = sizeof(int);

        if ((getsockopt(sock_fd, SOL_SOCKET, SO_ERROR, (void *) &opt, &slen) < 0) || (opt > 0))
        {
            https_close(hi);

            https_init(hi, https, verify);

            if ((ret = https_connect(hi, host, port)) < 0)
            {
                https_close(hi);

                _error = ret;

                return -1;
            }
        }
//      else
//          printf("socket reuse: %d \n", sock_fd);
    }

    strncpy(hi->url.host, host, strlen(host));
    strncpy(hi->url.port, port, strlen(port));
    strncpy(hi->url.path, dir, strlen(dir));

    return 0;
}